

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O3

bool leveldb::GetVarint32(Slice *input,uint32_t *value)

{
  uint uVar1;
  byte bVar2;
  size_t sVar3;
  byte *pbVar4;
  uint uVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  
  sVar3 = input->size_;
  if ((long)sVar3 < 1) {
    return false;
  }
  pbVar4 = (byte *)input->data_;
  bVar2 = *pbVar4;
  uVar7 = (uint)bVar2;
  if ((char)bVar2 < '\0') {
    pbVar6 = pbVar4 + 1;
    uVar8 = 0;
    uVar5 = 0;
    do {
      if (0x15 < uVar5) {
        return false;
      }
      if (pbVar4 + sVar3 <= pbVar6) {
        return false;
      }
      uVar1 = uVar5 + 7;
      uVar8 = uVar8 | (uVar7 & 0x7f) << ((byte)uVar5 & 0x1f);
      bVar2 = *pbVar6;
      uVar7 = (uint)bVar2;
      pbVar6 = pbVar6 + 1;
      uVar5 = uVar1;
    } while ((char)bVar2 < '\0');
    *value = uVar7 << ((byte)uVar1 & 0x1f) | uVar8;
  }
  else {
    *value = (uint)bVar2;
    pbVar6 = pbVar4 + 1;
  }
  input->data_ = (char *)pbVar6;
  input->size_ = (long)(pbVar4 + sVar3) - (long)pbVar6;
  return true;
}

Assistant:

size_t size() const { return size_; }